

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.cxx
# Opt level: O3

bool __thiscall cmCMakePath::IsPrefix(cmCMakePath *this,cmCMakePath *path)

{
  _List *p_Var1;
  _List *p_Var2;
  bool bVar3;
  int iVar4;
  path *ppVar5;
  long lVar6;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var7;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var8;
  path *ppVar9;
  path *ppVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool local_58;
  bool local_54;
  path *local_48;
  long local_40;
  
  p_Var1 = &(this->Path)._M_cmpts;
  _Var7._M_head_impl =
       (this->Path)._M_cmpts._M_impl._M_t.
       super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
       ._M_t.
       super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
       .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
  if (((ulong)_Var7._M_head_impl & 3) == 0) {
    ppVar5 = (path *)std::filesystem::__cxx11::path::_List::begin();
    _Var7._M_head_impl =
         (p_Var1->_M_impl)._M_t.
         super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         ._M_t.
         super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
    bVar11 = false;
  }
  else {
    bVar11 = (this->Path)._M_pathname._M_string_length == 0;
    ppVar5 = (path *)0x0;
  }
  local_58 = ((ulong)_Var7._M_head_impl & 3) == 0;
  if (local_58) {
    local_48 = (path *)std::filesystem::__cxx11::path::_List::end();
  }
  else {
    local_48 = (path *)0x0;
  }
  local_58 = !local_58;
  p_Var2 = &(path->Path)._M_cmpts;
  _Var7._M_head_impl =
       (path->Path)._M_cmpts._M_impl._M_t.
       super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
       ._M_t.
       super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
       .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
  if (((ulong)_Var7._M_head_impl & 3) == 0) {
    lVar6 = std::filesystem::__cxx11::path::_List::begin();
    _Var7._M_head_impl =
         (p_Var2->_M_impl)._M_t.
         super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         ._M_t.
         super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
    bVar12 = false;
  }
  else {
    bVar12 = (path->Path)._M_pathname._M_string_length == 0;
    lVar6 = 0;
  }
  local_54 = ((ulong)_Var7._M_head_impl & 3) == 0;
  if (local_54) {
    local_40 = std::filesystem::__cxx11::path::_List::end();
  }
  else {
    local_40 = 0;
  }
  local_54 = !local_54;
  _Var7._M_head_impl =
       (p_Var1->_M_impl)._M_t.
       super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
       ._M_t.
       super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
       .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
  bVar3 = bVar11 != local_58;
  if (((ulong)_Var7._M_head_impl & 3) == 0) {
    bVar3 = ppVar5 != local_48;
  }
  if (bVar3) {
    _Var8._M_head_impl =
         (p_Var2->_M_impl)._M_t.
         super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         ._M_t.
         super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
    ppVar10 = ppVar5;
    do {
      bVar3 = bVar12 != local_54;
      if (((ulong)_Var8._M_head_impl & 3) == 0) {
        bVar3 = lVar6 != local_40;
      }
      ppVar5 = ppVar10;
      if (!bVar3) break;
      ppVar9 = &this->Path;
      if (((ulong)_Var7._M_head_impl & 3) == 0) {
        ppVar9 = ppVar10;
      }
      iVar4 = std::filesystem::__cxx11::path::compare(ppVar9);
      _Var7._M_head_impl =
           (this->Path)._M_cmpts._M_impl._M_t.
           super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
           ._M_t.
           super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
           .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
           _M_head_impl;
      if (iVar4 != 0) break;
      ppVar5 = (path *)&(((path *)&ppVar10[1]._M_pathname)->_M_pathname)._M_string_length;
      if (((ulong)_Var7._M_head_impl & 3) != 0) {
        bVar11 = true;
        ppVar5 = ppVar10;
      }
      _Var8._M_head_impl =
           (p_Var2->_M_impl)._M_t.
           super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
           ._M_t.
           super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
           .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
           _M_head_impl;
      bVar3 = bVar11 != local_58;
      if (((ulong)_Var7._M_head_impl & 3) == 0) {
        bVar3 = ppVar5 != local_48;
      }
      bVar13 = ((ulong)_Var8._M_head_impl & 3) != 0;
      if (bVar13) {
        bVar12 = true;
      }
      if (!bVar13) {
        lVar6 = lVar6 + 0x30;
      }
      ppVar10 = ppVar5;
    } while (bVar3);
  }
  if (((ulong)_Var7._M_head_impl & 3) == 0) {
    if (ppVar5 == local_48) {
      return true;
    }
  }
  else {
    ppVar5 = &this->Path;
    if (bVar11 == local_58) {
      return true;
    }
  }
  if ((((path *)&ppVar5->_M_pathname)->_M_pathname)._M_string_length == 0) {
    bVar11 = bVar12 != local_54;
    if ((*(byte *)&(p_Var2->_M_impl)._M_t.
                   super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                   .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                   _M_head_impl & 3) == 0) {
      bVar11 = lVar6 != local_40;
    }
  }
  else {
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool cmCMakePath::IsPrefix(const cmCMakePath& path) const
{
  auto prefix_it = this->Path.begin();
  auto prefix_end = this->Path.end();
  auto path_it = path.Path.begin();
  auto path_end = path.Path.end();

  while (prefix_it != prefix_end && path_it != path_end &&
         *prefix_it == *path_it) {
    ++prefix_it;
    ++path_it;
  }
  return (prefix_it == prefix_end) ||
    (prefix_it->empty() && path_it != path_end);
}